

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O1

ASN1_TYPE * ASN1_generate_v3(char *str,X509V3_CTX *cnf)

{
  int iVar1;
  size_t sVar2;
  ASN1_TYPE *pAVar3;
  int in_R9D;
  uint8_t *der;
  ScopedCBB cbb;
  uint8_t *local_58;
  CBB local_50;
  
  CBB_zero(&local_50);
  pAVar3 = (ASN1_TYPE *)0x0;
  iVar1 = CBB_init(&local_50,0);
  if (iVar1 != 0) {
    pAVar3 = (ASN1_TYPE *)0x0;
    iVar1 = generate_v3(&local_50,str,(X509V3_CTX *)cnf,1,0,in_R9D);
    if (iVar1 != 0) {
      sVar2 = CBB_len(&local_50);
      if (sVar2 < 0x10001) {
        local_58 = CBB_data(&local_50);
        sVar2 = CBB_len(&local_50);
        pAVar3 = d2i_ASN1_TYPE((ASN1_TYPE **)0x0,&local_58,sVar2);
      }
      else {
        pAVar3 = (ASN1_TYPE *)0x0;
        ERR_put_error(0xc,0,0xb1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                      ,0x48);
      }
    }
  }
  CBB_cleanup(&local_50);
  return pAVar3;
}

Assistant:

ASN1_TYPE *ASN1_generate_v3(const char *str, const X509V3_CTX *cnf) {
  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 0) ||  //
      !generate_v3(cbb.get(), str, cnf, /*tag=*/0, ASN1_GEN_FORMAT_ASCII,
                   /*depth=*/0)) {
    return nullptr;
  }

  // While not strictly necessary to avoid a DoS (we rely on any super-linear
  // checks being performed internally), cap the overall output to
  // |ASN1_GEN_MAX_OUTPUT| so the externally-visible behavior is consistent.
  if (CBB_len(cbb.get()) > ASN1_GEN_MAX_OUTPUT) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
    return nullptr;
  }

  const uint8_t *der = CBB_data(cbb.get());
  return d2i_ASN1_TYPE(nullptr, &der, CBB_len(cbb.get()));
}